

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O2

JavascriptDate *
Js::JavascriptDate::NewInstanceAsConstructor
          (Arguments *args,ScriptContext *scriptContext,bool forceCurrentDate)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptDate *pJVar6;
  JavascriptDate *pJVar7;
  Var pvVar8;
  JavascriptString *pParseString;
  uint i;
  ulong uVar9;
  Type value;
  double dVar10;
  double adStack_80 [2];
  double resTime;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    adStack_80[0] = 5.42468417252716e-317;
    Throw::LogAssert();
    adStack_80[0] = 5.42469207757749e-317;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    adStack_80[0] = 5.42471085207203e-317;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x6a,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  adStack_80[0] = 5.42472073338495e-317;
  pJVar6 = JavascriptLibrary::CreateDate((scriptContext->super_ScriptContextBase).javascriptLibrary)
  ;
  if (!forceCurrentDate) {
    uVar3 = *(uint *)&args->Info & 0xffffff;
    if (uVar3 == 2) {
      adStack_80[0] = 5.42479830169134e-317;
      pvVar8 = Arguments::operator[](args,1);
      adStack_80[0] = 5.42480225421651e-317;
      bVar2 = VarIs<Js::JavascriptDate>(pvVar8);
      adStack_80[0] = 5.42480917113555e-317;
      pvVar8 = Arguments::operator[](args,1);
      if (bVar2) {
        adStack_80[0] = 5.42481559398895e-317;
        pJVar7 = VarTo<Js::JavascriptDate>(pvVar8);
        value = (pJVar7->m_date).m_tvUtc;
      }
      else {
        adStack_80[0] = 5.42487784626033e-317;
        pvVar8 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pvVar8,scriptContext);
        adStack_80[0] = 5.42488328098243e-317;
        bVar2 = VarIs<Js::JavascriptString>(pvVar8);
        if (bVar2) {
          adStack_80[0] = 5.42489118603276e-317;
          pParseString = VarTo<Js::JavascriptString>(pvVar8);
          adStack_80[0] = 5.42489662075487e-317;
          value = DateImplementation::UtcTimeFromStr(scriptContext,pParseString);
        }
        else {
          adStack_80[0] = 5.42501470244422e-317;
          value = JavascriptConversion::ToNumber(pvVar8,scriptContext);
        }
      }
      adStack_80[0] = 5.42501717277245e-317;
      pvVar8 = JavascriptNumber::ToVar(value);
      adStack_80[0] = 5.42502112529762e-317;
      dVar10 = TimeClip(pvVar8);
      goto LAB_00a78c14;
    }
    if (uVar3 != 1) {
      uVar9 = 1;
      do {
        if ((7 < uVar9) || ((SUB84(args->Info,0) & 0xffffff) <= uVar9)) {
          for (uVar9 = 0; uVar9 != 7; uVar9 = uVar9 + 1) {
            if (uVar9 < (*(uint *)&args->Info & 0xffffff) - 1) {
              adStack_80[0] = 5.42491885370893e-317;
              dVar10 = JavascriptConversion::ToInteger(adStack_80[uVar9 + 1]);
            }
            else {
              dVar10 = 1.0;
              if (uVar9 != 2) {
                dVar10 = 0.0;
              }
            }
            adStack_80[uVar9 + 1] = dVar10;
          }
          adStack_80[0] = 5.42500235080308e-317;
          dVar10 = DateUtilities::TvFromDate
                             ((double)(~-(ulong)(adStack_80[1] < 100.0) & (ulong)adStack_80[1] |
                                      (~-(ulong)(0.0 <= adStack_80[1]) & (ulong)adStack_80[1] |
                                      (ulong)(adStack_80[1] + 1900.0) &
                                      -(ulong)(0.0 <= adStack_80[1])) &
                                      -(ulong)(adStack_80[1] < 100.0)),resTime,local_68 + -1.0,
                              local_50 * 1000.0 + local_60 * 3600000.0 + local_58 * 60000.0 +
                              local_48);
          adStack_80[0] = 5.42500976178776e-317;
          DateImplementation::SetTvLcl(&pJVar6->m_date,dVar10,scriptContext);
          return pJVar6;
        }
        adStack_80[0] = 5.42484128540253e-317;
        pvVar8 = Arguments::operator[](args,(int)uVar9);
        adStack_80[0] = 5.42484672012464e-317;
        local_38 = JavascriptConversion::ToNumber(pvVar8,scriptContext);
        adStack_80[uVar9] = local_38;
        adStack_80[0] = 5.42485511924062e-317;
        BVar4 = JavascriptNumber::IsNan(local_38);
        dVar10 = local_38;
        if (BVar4 != 0) break;
        adStack_80[0] = 5.42486203615966e-317;
        bVar2 = NumberUtilities::IsFinite(local_38);
        uVar9 = uVar9 + 1;
        dVar10 = local_38;
      } while (bVar2);
      goto LAB_00a78c14;
    }
  }
  adStack_80[0] = 5.42473950787949e-317;
  adStack_80[1] = DateImplementation::NowFromHiResTimer(scriptContext);
  if (scriptContext->TTDShouldPerformReplayAction == true) {
    adStack_80[0] = 5.42475976457097e-317;
    TTD::EventLog::ReplayDateTimeEvent(scriptContext->threadContext->TTDLog,adStack_80 + 1);
    dVar10 = adStack_80[1];
  }
  else {
    dVar10 = adStack_80[1];
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      adStack_80[0] = 5.4247859500502e-317;
      local_38 = adStack_80[1];
      TTD::EventLog::RecordDateTimeEvent(scriptContext->threadContext->TTDLog,adStack_80[1]);
      dVar10 = local_38;
    }
  }
LAB_00a78c14:
  adStack_80[0] = 5.42502705408537e-317;
  DateImplementation::SetTvUtc(&pJVar6->m_date,dVar10);
  return pJVar6;
}

Assistant:

JavascriptDate* JavascriptDate::NewInstanceAsConstructor(Js::Arguments args, ScriptContext* scriptContext, bool forceCurrentDate)
    {
        Assert(scriptContext);

        double timeValue = 0;
        JavascriptDate* pDate;

        pDate = scriptContext->GetLibrary()->CreateDate();


        //
        // [15.9.3.3]
        // No arguments passed. Return the current time
        //
        if (forceCurrentDate || args.Info.Count == 1)
        {
            double resTime = DateImplementation::NowFromHiResTimer(scriptContext);

#if ENABLE_TTD
            if(scriptContext->ShouldPerformReplayAction())
            {
                scriptContext->GetThreadContext()->TTDLog->ReplayDateTimeEvent(&resTime);
            }
            else if(scriptContext->ShouldPerformRecordAction())
            {
                scriptContext->GetThreadContext()->TTDLog->RecordDateTimeEvent(resTime);
            }
            else
            {
                ;
            }
#endif

            pDate->m_date.SetTvUtc(resTime);
            return pDate;
        }

        //
        // [15.9.3.2]
        // One argument given
        // If string parse it and use that timeValue
        // Else convert to Number and use that as timeValue
        //
        if (args.Info.Count == 2)
        {
            if (VarIs<JavascriptDate>(args[1]))
            {
                JavascriptDate* dateObject = VarTo<JavascriptDate>(args[1]);
                timeValue = ((dateObject)->m_date).m_tvUtc;
            }
            else
            {
                Var value = JavascriptConversion::ToPrimitive<Js::JavascriptHint::None>(args[1], scriptContext);
                if (VarIs<JavascriptString>(value))
                {
                    timeValue = ParseHelper(scriptContext, VarTo<JavascriptString>(value));
                }
                else
                {
                    timeValue = JavascriptConversion::ToNumber(value, scriptContext);
                }
            }
            
            timeValue = TimeClip(JavascriptNumber::New(timeValue, scriptContext));

            pDate->m_date.SetTvUtc(timeValue);
            return pDate;
        }

        //
        // [15.9.3.1]
        // Date called with two to seven arguments
        //

        const int parameterCount = 7;
        double values[parameterCount];

        for (uint i=1; i < args.Info.Count && i < parameterCount+1; i++)
        {
            double curr = JavascriptConversion::ToNumber(args[i], scriptContext);
            values[i-1] = curr;
            if (JavascriptNumber::IsNan(curr) || !NumberUtilities::IsFinite(curr))
            {
                pDate->m_date.SetTvUtc(curr);
                return pDate;
            }
        }

        for (uint i=0; i < parameterCount; i++)
        {
            if ( i >= args.Info.Count-1 )
            {
                values[i] = ( i == 2 );
                continue;
            }
            // MakeTime (ES5 15.9.1.11) && MakeDay (ES5 15.9.1.12) always
            // call ToInteger (which is same as JavascriptConversion::ToInteger) on arguments.
            // All are finite (not Inf or Nan) as we check them explicitly in the previous loop.
            // +-0 & +0 are same in this context.
#pragma prefast(suppress:6001, "value index i < args.Info.Count - 1 are initialized")
            values[i] = JavascriptConversion::ToInteger(values[i]);
        }

        // adjust the year
        if (values[0] < 100 && values[0] >= 0)
            values[0] += 1900;

        // Get the local time value.
        timeValue = DateImplementation::TvFromDate(values[0], values[1], values[2] - 1,
            values[3] * 3600000 + values[4] * 60000 + values[5] * 1000 + values[6]);

        // Set the time.
        pDate->m_date.SetTvLcl(timeValue, scriptContext);

        return pDate;
    }